

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.hpp
# Opt level: O0

void __thiscall
actorpp::detail::ChannelImpl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::push
          (ChannelImpl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *item)

{
  element_type *__m;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *item_local;
  ChannelImpl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *this_local;
  
  lock._8_8_ = item;
  __m = std::
        __shared_ptr_access<actorpp::detail::ActorImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<actorpp::detail::ActorImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)this);
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&__m->mut);
  std::
  queue<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::deque<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::push(&this->elements,(value_type *)lock._8_8_);
  std::__shared_ptr_access<actorpp::detail::ActorImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<actorpp::detail::ActorImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)this);
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return;
}

Assistant:

void push(T &&item) {
    std::unique_lock<std::mutex> lock(actor_impl->mut);
    elements.push(std::move(item));
    actor_impl->cv.notify_one();
  }